

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_parseFloatingLiteralTest_Test::
~OpenDDLParserTest_parseFloatingLiteralTest_Test
          (OpenDDLParserTest_parseFloatingLiteralTest_Test *this)

{
  pointer ppVVar1;
  
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0018aff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OpenDDLParserTest).m_logs);
  ppVVar1 = (this->super_OpenDDLParserTest).m_data.
            super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->super_OpenDDLParserTest).m_data.
                                  super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseFloatingLiteralTest) {
    size_t len(0);
    Value *data(nullptr);
    char token1[] = "1.0f", *end1(findEnd(token1, len));
    char *out = OpenDDLParser::parseFloatingLiteral(token1, end1, &data);
    EXPECT_NE(out, token1);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_float, data->m_type);
    EXPECT_EQ(1.0f, data->getFloat());
    registerValueForDeletion(data);

    char token2[] = "-1.0f", *end2(findEnd(token2, len));
    out = OpenDDLParser::parseFloatingLiteral(token2, end2, &data);
    EXPECT_NE(out, token2);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_float, data->m_type);
    EXPECT_EQ(-1.0f, data->getFloat());
    registerValueForDeletion(data);
}